

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image2D.cpp
# Opt level: O0

bool __thiscall Image2D::WritePixel2File(Image2D *this,Vec3 **colors)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  ostream *poVar5;
  float *pfVar6;
  Vec3 **in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  char *in_stack_00000008;
  void *in_stack_00000010;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  char *in_stack_00000028;
  uchar *output_image;
  int b;
  int g;
  int r;
  Vec3 color;
  int i;
  int j;
  Vec3 *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  int stride_bytes;
  void *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  int comp;
  undefined8 in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  Image2D *in_stack_ffffffffffffff98;
  Vec3 *this_00;
  Image2D *in_stack_ffffffffffffffb0;
  Vec3 local_2c;
  int local_20;
  int local_1c;
  Vec3 **data;
  int in_stack_fffffffffffffffc;
  
  comp = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  stride_bytes = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (*(int *)(in_RDI + 0x46) == 0) {
    bVar4 = OpenFile(in_stack_ffffffffffffff98);
    if (!bVar4) {
      return false;
    }
    std::operator<<((ostream *)(in_RDI + 6),"P3\n");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)(in_RDI + 6),*(int *)(in_RDI + 4));
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)((long)in_RDI + 0x24));
    std::operator<<(poVar5,"\n");
    std::operator<<((ostream *)(in_RDI + 6),"255\n");
    local_1c = *(int *)((long)in_RDI + 0x24);
    while (local_1c = local_1c + -1, -1 < local_1c) {
      for (local_20 = 0; local_20 < *(int *)(in_RDI + 4); local_20 = local_20 + 1) {
        this_00 = &local_2c;
        Vec3::Vec3((Vec3 *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        pfVar6 = Vec3::operator[](this_00,0);
        fVar1 = *pfVar6;
        pfVar6 = Vec3::operator[](&local_2c,1);
        fVar2 = *pfVar6;
        pfVar6 = Vec3::operator[](&local_2c,2);
        fVar3 = *pfVar6;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)(in_RDI + 6),(int)(fVar1 * 255.99));
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)(fVar2 * 255.99));
        poVar5 = std::operator<<(poVar5," ");
        in_stack_ffffffffffffff60 =
             (ostream *)std::ostream::operator<<(poVar5,(int)(fVar3 * 255.99));
        std::operator<<(in_stack_ffffffffffffff60,"\n");
        Vec3::~Vec3(&local_2c);
      }
    }
    CloseFile((Image2D *)0x1128a2);
  }
  else {
    data = in_RDI;
    FramebufferToArray(in_stack_ffffffffffffffb0,in_RDI);
    if (*(int *)(in_RDI + 0x46) == 1) {
      std::__cxx11::string::c_str();
      stbi_write_png(in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                     (int)in_stack_ffffffffffffff80,comp,in_stack_ffffffffffffff70,stride_bytes);
    }
    else if (*(int *)(in_RDI + 0x46) == 2) {
      std::__cxx11::string::c_str();
      stbi_write_bmp(in_stack_00000028,in_stack_00000024,in_stack_00000020,in_stack_0000001c,
                     in_stack_00000010);
    }
    else if (*(int *)(in_RDI + 0x46) == 3) {
      std::__cxx11::string::c_str();
      stbi_write_tga(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffffc,data
                    );
    }
  }
  return true;
}

Assistant:

bool
Image2D::WritePixel2File(Vec3 **colors)
{
	if (m_type == FileType::PPM) {
		if (!OpenFile()) {
			return false;
		}

		m_ofstream << "P3\n";
		m_ofstream << m_width << " " << m_height << "\n";
		m_ofstream << "255\n";

		for (int j = m_height - 1; j >= 0; --j) {
			for (int i = 0; i < m_width; ++i) {

				Vec3 color = colors[i][j];
				int r = int(255.99 * color[0]);
				int g = int(255.99 * color[1]);
				int b = int(255.99 * color[2]);

				m_ofstream << r << " " << g << " " << b << "\n";
			}
		}
		CloseFile();
	} 
	else {
		unsigned char *output_image = FramebufferToArray(colors);
		if (m_type == FileType::PNG) {
			stbi_write_png(m_name.c_str(), m_width, m_height, m_components, output_image, m_width * m_components);
		}
		else if (m_type == FileType::BMP) {
			stbi_write_bmp(m_name.c_str(), m_width, m_height, m_components, output_image);
		}
		else if (m_type == FileType::TGA) {
			stbi_write_tga(m_name.c_str(), m_width, m_height, m_components, output_image);
		}
		else if (m_type == FileType::HDR) {
			//tbi_write_hdr(m_name.c_str(), m_width, m_height, 3, output_image);
		}
	}

	return true;
}